

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

char ** p2sc_dirscan(char *name)

{
  int iVar1;
  char **ppcVar2;
  int *piVar3;
  undefined8 uVar4;
  
  if (far == (GArray *)0x0) {
    far = (GArray *)g_array_new(1,0,8);
    iVar1 = nftw(name,descend,0x40,0);
    if (iVar1 != -1) {
      ppcVar2 = (char **)g_array_free(far,0);
      far = (GArray *)0x0;
      return ppcVar2;
    }
    piVar3 = __errno_location();
    uVar4 = g_strerror(*piVar3);
    _p2sc_msg("p2sc_dirscan",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x19d,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"nftw(%s): %s",
              name,uVar4);
  }
  else {
    _p2sc_msg("p2sc_dirscan",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x198,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,"far != NULL");
  }
  exit(1);
}

Assistant:

char **p2sc_dirscan(const char *name) {
    gboolean segfree = TRUE;
    char **ret = NULL;

    if (far)
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "far != NULL");
    else
        far = g_array_new(TRUE, FALSE, sizeof(char *));

    if (nftw(name, descend, 64, 0) == -1)
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "nftw(%s): %s", name, g_strerror(errno));
    else
        segfree = FALSE;

    ret = (char **) g_array_free(far, segfree);
    far = NULL;

    return ret;
}